

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  uint64_t uVar1;
  MSize len_00;
  int iVar2;
  bool bVar3;
  GCstr *sx;
  GCobj *o;
  int hashalg;
  MSize coll;
  StrHash hash;
  MSize len;
  global_State *g;
  size_t lenx_local;
  char *str_local;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  if (lenx - 1 < 0x7ffffeff) {
    len_00 = (MSize)lenx;
    hashalg = (*hash_sparse)(*(uint64_t *)(uVar1 + 0xb0),str,len_00);
    o._4_4_ = 0;
    sx = *(GCstr **)(*(long *)(uVar1 + 0x98) + (ulong)(hashalg & *(uint *)(uVar1 + 0xa0)) * 8);
    bVar3 = ((ulong)sx & 1) != 0;
    if (bVar3) {
      hashalg = (*hash_dense)(*(uint64_t *)(uVar1 + 0xb0),hashalg,str,len_00);
      sx = (GCstr *)(*(ulong *)(*(long *)(uVar1 + 0x98) +
                               (ulong)(hashalg & *(uint *)(uVar1 + 0xa0)) * 8) & 0xfffffffffffffffe)
      ;
    }
    o._0_4_ = (uint)bVar3;
    for (; sx != (GCstr *)0x0; sx = (GCstr *)(sx->nextgc).gcptr64) {
      if ((sx->hash == hashalg) && (sx->len == len_00)) {
        iVar2 = memcmp(str,sx + 1,lenx & 0xffffffff);
        if (iVar2 == 0) {
          if ((sx->marked & (*(byte *)(uVar1 + 0x20) ^ 3) & 3) != 0) {
            sx->marked = sx->marked ^ 3;
          }
          return sx;
        }
        o._4_4_ = o._4_4_ + 1;
      }
      o._4_4_ = o._4_4_ + 1;
    }
    if ((o._4_4_ < 0x21) || ((uint)o != 0)) {
      L_local = (lua_State *)lj_str_alloc(L,str,len_00,hashalg,(uint)o);
    }
    else {
      L_local = (lua_State *)lj_str_rehash_chain(L,hashalg,str,len_00);
    }
  }
  else {
    if (lenx != 0) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    L_local = (lua_State *)(uVar1 + 0x78);
  }
  return (GCstr *)L_local;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g = G(L);
  if (lenx-1 < LJ_MAX_STR-1) {
    MSize len = (MSize)lenx;
    StrHash hash = hash_sparse(g->str.seed, str, len);
    MSize coll = 0;
    int hashalg = 0;
    /* Check if the string has already been interned. */
    GCobj *o = gcref(g->str.tab[hash & g->str.mask]);
#if LUAJIT_SECURITY_STRHASH
    if (LJ_UNLIKELY((uintptr_t)o & 1)) {  /* Secondary hash for this chain? */
      hashalg = 1;
      hash = hash_dense(g->str.seed, hash, str, len);
      o = (GCobj *)(gcrefu(g->str.tab[hash & g->str.mask]) & ~(uintptr_t)1);
    }
#endif
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == hash && sx->len == len) {
	if (memcmp(str, strdata(sx), len) == 0) {
	  if (isdead(g, o)) flipwhite(o);  /* Resurrect if dead. */
	  return sx;  /* Return existing string. */
	}
	coll++;
      }
      coll++;
      o = gcnext(o);
    }
#if LUAJIT_SECURITY_STRHASH
    /* Rehash chain if there are too many collisions. */
    if (LJ_UNLIKELY(coll > LJ_STR_MAXCOLL) && !hashalg) {
      return lj_str_rehash_chain(L, hash, str, len);
    }
#endif
    /* Otherwise allocate a new string. */
    return lj_str_alloc(L, str, len, hash, hashalg);
  } else {
    if (lenx)
      lj_err_msg(L, LJ_ERR_STROV);
    return &g->strempty;
  }
}